

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
ZXing::Matrix<ZXing::Trit>::Matrix(Matrix<ZXing::Trit> *this,int width,int height,value_t val)

{
  int iVar1;
  value_type *__n;
  vector<ZXing::Trit,_std::allocator<ZXing::Trit>_> *this_00;
  invalid_argument *this_01;
  int in_EDX;
  int in_ESI;
  value_type *in_RDI;
  vector<ZXing::Trit,_std::allocator<ZXing::Trit>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  *(int *)in_RDI = in_ESI;
  *(int *)(in_RDI + 4) = in_EDX;
  __n = in_RDI + 8;
  this_00 = (vector<ZXing::Trit,_std::allocator<ZXing::Trit>_> *)
            (long)(*(int *)in_RDI * *(int *)(in_RDI + 4));
  std::allocator<ZXing::Trit>::allocator((allocator<ZXing::Trit> *)0x300c88);
  std::vector<ZXing::Trit,_std::allocator<ZXing::Trit>_>::vector
            (this_00,(size_type)__n,in_RDI,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::allocator<ZXing::Trit>::~allocator((allocator<ZXing::Trit> *)0x300cad);
  if (in_ESI != 0) {
    iVar1 = Size<std::vector<ZXing::Trit,std::allocator<ZXing::Trit>>>(in_stack_ffffffffffffffa0);
    if (iVar1 / in_ESI != in_EDX) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_01,"Invalid size: width * height is too big");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return;
}

Assistant:

Matrix(int width, int height, value_t val = {}) : _width(width), _height(height), _data(_width * _height, val) {
		if (width != 0 && Size(_data) / width != height)
			throw std::invalid_argument("Invalid size: width * height is too big");
	}